

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::GroupNode::setMaterial
          (GroupNode *this,Ref<embree::SceneGraph::MaterialNode> *material)

{
  pointer pRVar1;
  Node *pNVar2;
  pointer pRVar3;
  MaterialNode *local_30;
  
  pRVar1 = (this->children).
           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar3 = (this->children).
                super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    pNVar2 = pRVar3->ptr;
    local_30 = material->ptr;
    if (local_30 != (MaterialNode *)0x0) {
      (*(local_30->super_Node).super_RefCount._vptr_RefCount[2])();
    }
    (*(pNVar2->super_RefCount)._vptr_RefCount[5])(pNVar2,&local_30);
    if (local_30 != (MaterialNode *)0x0) {
      (*(local_30->super_Node).super_RefCount._vptr_RefCount[3])();
    }
  }
  return;
}

Assistant:

virtual void setMaterial(Ref<MaterialNode> material) {
        for (auto& child : children) child->setMaterial(material);
      }